

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

String * __thiscall
Diligent::GetPipelineShadingRateFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_SHADING_RATE_FLAGS Flags)

{
  size_type sVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  string msg;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"NONE","");
  }
  else {
    uVar2 = (ulong)this & 0xffffffff;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar1 = 0;
    while( true ) {
      if (sVar1 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      bVar3 = (byte)uVar2;
      bVar4 = -bVar3 & bVar3;
      if ((bVar4 != 1) && (bVar4 != 2)) {
        FormatString<char[33]>(&local_50,(char (*) [33])"Unexpected pipeline shading rate");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"GetPipelineShadingRateFlagsString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0xaf7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (bVar4 == bVar3) break;
      uVar2 = (ulong)(bVar3 ^ bVar4);
      sVar1 = __return_storage_ptr__->_M_string_length;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetPipelineShadingRateFlagsString(PIPELINE_SHADING_RATE_FLAGS Flags)
{
    if (Flags == PIPELINE_SHADING_RATE_FLAG_NONE)
        return "NONE";

    String Result;
    while (Flags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        PIPELINE_SHADING_RATE_FLAGS Bit = ExtractLSB(Flags);

        if (!Result.empty())
            Result += " | ";

        static_assert(PIPELINE_SHADING_RATE_FLAG_LAST == 0x02, "Please update the switch below to handle the new pipeline shading rate flag");
        switch (Bit)
        {
            // clang-format off
            case PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE: Result += "PER_PRIMITIVE"; break;
            case PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED: Result += "TEXTURE_BASED"; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected pipeline shading rate");
                Result += "Unknown";
        }
    }
    return Result;
}